

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_block.h
# Opt level: O0

StringBlock * google::protobuf::internal::StringBlock::New(StringBlock *next)

{
  unsigned_short *puVar1;
  StringBlock *this;
  void *p;
  size_type next_size;
  StringBlock *pSStack_10;
  size_type size;
  StringBlock *next_local;
  
  pSStack_10 = next;
  p._6_2_ = min_size();
  p._4_2_ = min_size();
  if (pSStack_10 != (StringBlock *)0x0) {
    p._6_2_ = pSStack_10->next_size_;
    p._2_2_ = p._6_2_ << 1;
    p._0_2_ = max_size();
    puVar1 = std::min<unsigned_short>((unsigned_short *)((long)&p + 2),(unsigned_short *)&p);
    p._4_2_ = *puVar1;
  }
  p._6_2_ = RoundedSize(p._6_2_);
  this = (StringBlock *)operator_new((ulong)p._6_2_);
  StringBlock(this,pSStack_10,true,p._6_2_,p._4_2_);
  return this;
}

Assistant:

inline StringBlock* StringBlock::New(StringBlock* next) {
  // Compute required size, rounding down to a multiple of sizeof(std:string)
  // so that we can optimize the allocation path. I.e., we incur a (constant
  // size) MOD() operation cost here to avoid any MUL() later on.
  size_type size = min_size();
  size_type next_size = min_size();
  if (next) {
    size = next->next_size_;
    next_size = std::min<size_type>(size * 2, max_size());
  }
  size = RoundedSize(size);
  void* p = ::operator new(size);
  return new (p) StringBlock(next, true, size, next_size);
}